

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

float deqp::gles3::Performance::anon_unknown_1::dummyCalculation(float initial,int workSize)

{
  int iVar1;
  int iVar2;
  int iVar4;
  bool bVar5;
  int iVar3;
  
  iVar4 = 0;
  if (0 < workSize) {
    iVar4 = workSize;
  }
  iVar2 = 0x7b;
  while( true ) {
    bVar5 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar5) break;
    initial = cosf((float)iVar2 + initial);
    iVar1 = (int)(initial * 10.0);
    iVar3 = -iVar1;
    if (0 < iVar1) {
      iVar3 = iVar1;
    }
    iVar2 = iVar3 + (iVar2 + 0x3f) % 0x6b;
  }
  return (float)iVar2 + initial;
}

Assistant:

static float dummyCalculation (float initial, int workSize)
{
	float	a = initial;
	int		b = 123;

	for (int ndx = 0; ndx < workSize; ++ndx)
	{
		a = deFloatCos(a + (float)b);
		b = (b + 63) % 107 + de::abs((int)(a*10.0f));
	}

	return a + (float)b;
}